

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O2

void QHttpHeadersPrivate::removeAll(Self *d,HeaderName *name)

{
  QHttpHeadersPrivate *pQVar1;
  Header *pHVar2;
  const_iterator cVar3;
  iterator iVar4;
  iterator iVar5;
  QList<Header> *this;
  
  pQVar1 = (d->d).ptr;
  cVar3.i = (pQVar1->headers).d.ptr;
  cVar3 = std::find_if<QList<Header>::const_iterator,headerNameMatches(HeaderName_const&)::__0>
                    (cVar3,cVar3.i + (pQVar1->headers).d.size,
                     (anon_class_8_1_898f2789_for__M_pred)name);
  pQVar1 = (d->d).ptr;
  pHVar2 = (pQVar1->headers).d.ptr;
  if (cVar3.i != pHVar2 + (pQVar1->headers).d.size) {
    QExplicitlySharedDataPointer<QHttpHeadersPrivate>::detach(d);
    this = &((d->d).ptr)->headers;
    iVar4 = QList<Header>::begin(this);
    iVar5 = QList<Header>::end(&((d->d).ptr)->headers);
    iVar4 = std::remove_if<QList<Header>::iterator,headerNameMatches(HeaderName_const&)::__0>
                      (((long)cVar3.i - (long)pHVar2) + iVar4.i,iVar5,
                       (anon_class_8_1_898f2789_for__M_pred)name);
    iVar5 = QList<Header>::end(&((d->d).ptr)->headers);
    QList<Header>::erase(this,(const_iterator)iVar4.i,(const_iterator)iVar5.i);
    return;
  }
  return;
}

Assistant:

void QHttpHeadersPrivate::removeAll(Self &d, const HeaderName &name)
{
    const auto it = std::find_if(d->headers.cbegin(), d->headers.cend(), headerNameMatches(name));

    if (it != d->headers.cend()) {
        // Found something to remove, calculate offset so we can proceed from the match-location
        const auto matchOffset = it - d->headers.cbegin();
        d.detach();
        // Rearrange all matches to the end and erase them
        d->headers.erase(std::remove_if(d->headers.begin() + matchOffset, d->headers.end(),
                                        headerNameMatches(name)),
                         d->headers.end());
    }
}